

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cc
# Opt level: O3

bool __thiscall avro::Validator::getNextFieldName(Validator *this,string *name)

{
  pointer pCVar1;
  element_type *peVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  name->_M_string_length = 0;
  *(name->_M_dataplus)._M_p = '\0';
  pCVar1 = (this->compoundStack_).
           super__Vector_base<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (-1 - (uint)((uint)(this->nextType_ + ~AVRO_NULL) < 6)) +
          (int)((long)(this->compoundStack_).
                      super__Vector_base<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * -0x55555555;
  if (-1 < (int)uVar4) {
    uVar4 = uVar4 & 0x7fffffff;
    peVar2 = pCVar1[uVar4].node.px;
    if (peVar2->type_ == AVRO_RECORD) {
      uVar5 = pCVar1[uVar4].pos - 1;
      uVar3 = (**(code **)((long)peVar2->_vptr_Node + 0x20))();
      if (uVar5 < uVar3) {
        peVar2 = pCVar1[uVar4].node.px;
        (**(code **)((long)peVar2->_vptr_Node + 0x40))(peVar2,uVar5 & 0xffffffff);
        std::__cxx11::string::_M_assign((string *)name);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool 
Validator::getNextFieldName(std::string &name) const
{
    bool found = false;
    name.clear();
    int idx = isCompound(nextType_) ? compoundStack_.size()-2 : compoundStack_.size()-1;
    if(idx >= 0 && compoundStack_[idx].node->type() == AVRO_RECORD) {
        size_t pos = compoundStack_[idx].pos-1;
        const NodePtr &node = compoundStack_[idx].node;
        if(pos < node->leaves()) {
            name = node->nameAt(pos);
            found = true;
        }
    }
    return found;
}